

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_union_cube(MDD a,uint32_t *values,size_t count)

{
  uint32_t uVar1;
  mddnode_t n;
  uint64_t uVar2;
  MDD MVar3;
  MDD down;
  MDD right;
  uint32_t na_value;
  mddnode_t na;
  size_t count_local;
  uint32_t *values_local;
  MDD a_local;
  
  if (a == 0) {
    a_local = lddmc_cube(values,count);
  }
  else if (a == 1) {
    if (count != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x6f5,"MDD lddmc_union_cube(MDD, uint32_t *, size_t)");
    }
    a_local = 1;
  }
  else {
    if (count == 0) {
      __assert_fail("count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x6f8,"MDD lddmc_union_cube(MDD, uint32_t *, size_t)");
    }
    n = LDD_GETNODE(a);
    uVar1 = mddnode_getvalue(n);
    a_local = a;
    if (uVar1 < *values) {
      uVar2 = mddnode_getright(n);
      MVar3 = lddmc_union_cube(uVar2,values,count);
      uVar2 = mddnode_getright(n);
      if (MVar3 != uVar2) {
        uVar2 = mddnode_getdown(n);
        a_local = lddmc_makenode(uVar1,uVar2,MVar3);
      }
    }
    else if (uVar1 == *values) {
      uVar2 = mddnode_getdown(n);
      MVar3 = lddmc_union_cube(uVar2,values + 1,count - 1);
      uVar2 = mddnode_getdown(n);
      if (MVar3 != uVar2) {
        uVar2 = mddnode_getright(n);
        a_local = lddmc_makenode(uVar1,MVar3,uVar2);
      }
    }
    else {
      uVar1 = *values;
      MVar3 = lddmc_cube(values + 1,count - 1);
      a_local = lddmc_makenode(uVar1,MVar3,a);
    }
  }
  return a_local;
}

Assistant:

MDD
lddmc_union_cube(MDD a, uint32_t* values, size_t count)
{
    if (a == lddmc_false) return lddmc_cube(values, count);
    if (a == lddmc_true) {
        assert(count == 0);
        return lddmc_true;
    }
    assert(count != 0);

    mddnode_t na = LDD_GETNODE(a);
    uint32_t na_value = mddnode_getvalue(na);

    /* Only create a new node if something actually changed */

    if (na_value < *values) {
        MDD right = lddmc_union_cube(mddnode_getright(na), values, count);
        if (right == mddnode_getright(na)) return a; // no actual change
        return lddmc_makenode(na_value, mddnode_getdown(na), right);
    } else if (na_value == *values) {
        MDD down = lddmc_union_cube(mddnode_getdown(na), values+1, count-1);
        if (down == mddnode_getdown(na)) return a; // no actual change
        return lddmc_makenode(na_value, down, mddnode_getright(na));
    } else /* na_value > *values */ {
        return lddmc_makenode(*values, lddmc_cube(values+1, count-1), a);
    }
}